

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O1

uint32_t WriteBinaryTexture(aiTexture *tex)

{
  long lVar1;
  size_t sVar2;
  int iVar3;
  uint32_t n;
  uint32_t t;
  uint32_t t_1;
  undefined4 local_24;
  uint local_20;
  uint local_1c;
  
  local_24 = 0x1236;
  fwrite(&local_24,4,1,(FILE *)out);
  fwrite(&local_24,4,1,(FILE *)out);
  lVar1 = ftell((FILE *)out);
  local_20 = tex->mWidth;
  fwrite(&local_20,4,1,(FILE *)out);
  local_1c = tex->mHeight;
  fwrite(&local_1c,4,1,(FILE *)out);
  sVar2 = fwrite(tex->achFormatHint,1,4,(FILE *)out);
  n = (int)sVar2 + 8;
  if (shortened == false) {
    iVar3 = 1;
    if (tex->mHeight != 0) {
      iVar3 = tex->mHeight * 4;
    }
    sVar2 = fwrite(tex->pcData,1,(ulong)(iVar3 * tex->mWidth),(FILE *)out);
    n = n + (int)sVar2;
  }
  ChangeInteger((int)lVar1 - 4,n);
  return n;
}

Assistant:

uint32_t WriteBinaryTexture(const aiTexture* tex)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AITEXTURE);

	len += Write<unsigned int>(tex->mWidth);
	len += Write<unsigned int>(tex->mHeight);
	len += static_cast<uint32_t>(fwrite(tex->achFormatHint,1,4,out));

	if(!shortened) {
		if (!tex->mHeight) {
			len += static_cast<uint32_t>(fwrite(tex->pcData,1,tex->mWidth,out));
		}
		else {
			len += static_cast<uint32_t>(fwrite(tex->pcData,1,tex->mWidth*tex->mHeight*4,out));
		}
	}

	ChangeInteger(old,len);
	return len;
}